

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_builder.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::subject::SubjectBuilder::GetComponent
          (string *__return_storage_ptr__,SubjectBuilder *this,string *key)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  _Alloc_hider _Var2;
  int iVar3;
  size_type *psVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pbVar1 = (this->components_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar5 != 0) {
    uVar6 = lVar5 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    __n = key->_M_string_length;
    psVar4 = &pbVar1[1]._M_string_length;
    uVar7 = 1;
    do {
      if ((psVar4[-4] == __n) &&
         ((__n == 0 || (iVar3 = bcmp((void *)psVar4[-5],__s2,__n), iVar3 == 0)))) {
        if (uVar7 < uVar6) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          _Var2._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar4 + -1))->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,_Var2._M_p,_Var2._M_p + *psVar4);
          return __return_storage_ptr__;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                   ,uVar6);
      }
      psVar4 = psVar4 + 8;
      uVar8 = uVar7 + 1;
      uVar7 = uVar7 + 2;
    } while (uVar8 < uVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectBuilder::GetComponent(const std::string& key)
{
    for (unsigned long i = 0; i < components_.size(); i+= 2)
    {
        if ((components_.at(i)) == key)
        {
            return components_.at(i + 1);
        }
    }

    return "";
}